

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.hpp
# Opt level: O1

const_iterator __thiscall toml::detail::location::line_begin(location *this)

{
  char *local_18;
  pointer local_10;
  char *local_8;
  
  local_8 = (this->iter_)._M_current;
  local_10 = (((this->source_).
               super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
             super__Vector_impl_data._M_start;
  std::
  __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
            (&local_18);
  return (const_iterator)local_18;
}

Assistant:

const_iterator line_begin() const noexcept
    {
        using reverse_iterator = std::reverse_iterator<const_iterator>;
        return std::find(reverse_iterator(this->iter()),
                         reverse_iterator(this->begin()), '\n').base();
    }